

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2291::Reactor::printItem(Reactor *this,JSON *j)

{
  ostream *poVar1;
  qpdf_offset_t qVar2;
  string local_38;
  JSON *local_18;
  JSON *j_local;
  Reactor *this_local;
  
  local_18 = j;
  j_local = (JSON *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  qVar2 = JSON::getStart(local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,qVar2);
  poVar1 = std::operator<<(poVar1,", ");
  qVar2 = JSON::getEnd(local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,qVar2);
  poVar1 = std::operator<<(poVar1,"): ");
  JSON::unparse_abi_cxx11_(&local_38,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void
Reactor::printItem(JSON const& j)
{
    std::cout << "[" << j.getStart() << ", " << j.getEnd() << "): " << j.unparse() << std::endl;
}